

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

LoopLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_loop(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x267) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x267;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    LoopLayerParams::LoopLayerParams(this_00.loop_);
    (this->layer_).loop_ = (LoopLayerParams *)this_00;
  }
  return (LoopLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::LoopLayerParams* NeuralNetworkLayer::mutable_loop() {
  if (!has_loop()) {
    clear_layer();
    set_has_loop();
    layer_.loop_ = new ::CoreML::Specification::LoopLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.loop)
  return layer_.loop_;
}